

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

bool anon_unknown.dwarf_b692::isAllowedToMemmove
               (Options *options,uint8_t *start,iterator indexStart,iterator indexEnd,
               ValueLength offsetSize)

{
  long lVar1;
  unsigned_long *puVar2;
  reference puVar3;
  long in_RSI;
  long in_RDI;
  long in_R8;
  size_t i;
  size_t n;
  size_t distance;
  ulong local_60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffb0;
  unsigned_long uVar4;
  unsigned_long local_38 [2];
  long local_28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_10;
  bool local_1;
  
  if ((*(int *)(in_RDI + 4) == 1) || ((in_R8 == 1 && (*(int *)(in_RDI + 4) == 2)))) {
    local_28 = in_RSI;
    local_38[0] = std::
                  distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffa8,local_38);
    uVar4 = *puVar2;
    for (local_60 = 0; lVar1 = local_28, local_60 < uVar4; local_60 = local_60 + 1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](&local_10,local_60);
      if (*(char *)(lVar1 + *puVar3) == '\0') {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isAllowedToMemmove(Options const* options, uint8_t const* start,
                        std::vector<ValueLength>::iterator indexStart,
                        std::vector<ValueLength>::iterator indexEnd,
                        ValueLength offsetSize) {
  VELOCYPACK_ASSERT(offsetSize == 1 || offsetSize == 2);

  if (options->paddingBehavior == Options::PaddingBehavior::NoPadding ||
      (offsetSize == 1 &&
       options->paddingBehavior == Options::PaddingBehavior::Flexible)) {
    std::size_t const distance = std::distance(indexStart, indexEnd);
    std::size_t const n = (std::min)(std::size_t(8 - 2 * offsetSize), distance);
    for (std::size_t i = 0; i < n; i++) {
      if (start[indexStart[i]] == 0x00) {
        return false;
      }
    }
    return true;
  }

  return false;
}